

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<std::complex<double>_>::Subst_Backward
          (TPZMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined8 extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double in_XMM1_Qa;
  undefined1 local_98 [24];
  long local_80;
  double local_78;
  double dStack_70;
  double local_60;
  undefined8 local_58;
  double local_50;
  double local_48;
  undefined1 local_40 [16];
  
  lVar7 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar4 = 0;
  if ((lVar7 == CONCAT44(extraout_var,iVar3)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    local_80 = CONCAT44(extraout_var_00,iVar3);
    iVar4 = 1;
    if (local_80 != 0 && -1 < extraout_var_00) {
      do {
        lVar7 = local_80 + -1;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar7);
        local_60 = in_XMM1_Qa;
        if (0 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) {
          lVar5 = 0;
          local_58 = extraout_XMM0_Qa;
          do {
            iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
            lVar2 = local_80;
            lVar6 = CONCAT44(extraout_var_01,iVar3);
            local_78 = 0.0;
            dStack_70 = 0.0;
            while (lVar2 < lVar6) {
              lVar6 = lVar6 + -1;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,lVar7,lVar6);
              local_50 = in_XMM1_Qa;
              local_48 = extraout_XMM0_Qa_00;
              (*(B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(B,lVar6,lVar5);
              local_98._0_8_ = local_48;
              local_98._8_8_ = local_50;
              local_40._8_8_ = in_XMM1_Qa;
              std::complex<double>::operator*=
                        ((complex<double> *)local_98,(complex<double> *)local_40);
              local_78 = local_78 + (double)local_98._0_8_;
              dStack_70 = dStack_70 + (double)local_98._8_8_;
            }
            (*(B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(B,lVar7,lVar5);
            in_XMM1_Qa = in_XMM1_Qa - dStack_70;
            local_98._0_8_ = __divdc3(extraout_XMM0_Qa_01 - local_78,in_XMM1_Qa,local_58,local_60);
            local_98._8_8_ = in_XMM1_Qa;
            (*(B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x23])(B,lVar7,lVar5,local_98);
            lVar5 = lVar5 + 1;
          } while (lVar5 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol);
        }
        bVar1 = 1 < local_80;
        local_80 = lVar7;
      } while (bVar1);
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

int TPZMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const {
	
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky) return( 0 );
	for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
			//
			TVar sum = 0.0;
			for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
        }
    }
    return( 1 );
}